

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_ploadi(dill_stream s,int type,int junk,int dest,int src,long offset)

{
  char **ppcVar1;
  void *pvVar2;
  uint rex;
  bool bVar3;
  bool bVar4;
  char cVar5;
  uint insn1;
  private_ctx pdVar6;
  char *pcVar7;
  int junk_00;
  int junk_01;
  uint uVar8;
  int insn3;
  uint uVar9;
  uint uVar10;
  int in_stack_ffffffffffffffa8;
  int iVar11;
  
  insn1 = (uint)ld_opcodes[type];
  pdVar6 = s->p;
  pvVar2 = pdVar6->mach_info;
  iVar11 = 0;
  bVar3 = true;
  uVar10 = dest;
  bVar4 = true;
  switch((ulong)(uint)type) {
  case 0:
  case 1:
    if (3 < dest) {
      uVar10 = 0;
    }
    if (type == 1) {
      iVar11 = 0;
      if (uVar10 == src) {
        uVar10 = 0;
      }
      BYTE_OUT2R(s,8,0x33,(uVar10 & 7) * 9 + 0xc0);
    }
    else {
      iVar11 = 0;
    }
    break;
  case 3:
    uVar10 = 0;
    if (src != dest) {
      uVar10 = dest;
    }
    BYTE_OUT2R(s,(uint)(7 < (int)uVar10) * 5 + 8,0x33,(uVar10 & 7) * 9 + 0xc0);
    pdVar6 = s->p;
  case 2:
    pcVar7 = pdVar6->cur_ip;
    if (pdVar6->code_limit <= pcVar7) {
      extend_dill_stream(s);
      pcVar7 = s->p->cur_ip;
    }
    *pcVar7 = 'f';
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    break;
  default:
    goto switchD_00117d1f_caseD_4;
  case 9:
    iVar11 = 0xf3;
    goto LAB_00117dfb;
  case 10:
    iVar11 = 0xf2;
LAB_00117dfb:
    bVar4 = false;
switchD_00117d1f_caseD_4:
    bVar3 = bVar4;
  }
  uVar9 = (uint)(type - 6U < 3) * 8;
  cVar5 = *(char *)((long)pvVar2 + 0x34);
  if (cVar5 != '\0') {
    pcVar7 = s->p->cur_ip;
    if (s->p->code_limit <= pcVar7) {
      extend_dill_stream(s);
      cVar5 = *(char *)((long)pvVar2 + 0x34);
      pcVar7 = s->p->cur_ip;
    }
    *pcVar7 = cVar5;
    if (s->dill_debug != 0) {
      dump_cur_dill_insn(s);
    }
    ppcVar1 = &s->p->cur_ip;
    *ppcVar1 = *ppcVar1 + 1;
    *(undefined1 *)((long)pvVar2 + 0x34) = 0;
  }
  rex = uVar9 + 4 + (uint)(7 < src);
  if ((int)uVar10 < 8) {
    rex = uVar9 | 7 < src;
  }
  uVar9 = src & 7;
  uVar8 = (uint)offset;
  if (uVar9 == 4) {
    if ((int)uVar8 != offset) {
LAB_00117f87:
      if (dest == src) {
        x86_64_arith3i(s,0,6,src,src,offset);
        x86_64_ploadi(s,type,junk_00,src,src,0);
      }
      else {
        BYTE_OUT1LR(s,dest < 8 ^ 9,dest & 7U | 0xb8,offset);
        x86_64_pload(s,type,junk_01,dest,src,dest);
      }
      goto LAB_0011811b;
    }
    if (offset != 0) {
      if (offset + 0x7fU < 0xff) {
        if (bVar3) {
          BYTE_OUT4R(s,rex,insn1,(uVar10 & 7) * 8 + 0x44,uVar8 & 0xff,uVar8);
        }
        else {
          BYTE_OUT1R5(s,iVar11,rex,0x10,(uVar10 & 7) * 8 + 0x44,uVar8 & 0xff,
                      in_stack_ffffffffffffffa8,iVar11);
        }
      }
      else if (bVar3) {
        BYTE_OUT3IR(s,rex,insn1,(uVar10 & 7) * 8 + 0x84,uVar8,uVar8);
      }
      else {
        BYTE_OUT1R4I(s,iVar11,rex,0x10,(uVar10 & 7) * 8 + 0x84,uVar8,in_stack_ffffffffffffffa8,
                     iVar11);
      }
      goto LAB_0011811b;
    }
    if (!bVar3) {
      insn3 = (uVar10 & 7) * 8 + 4;
      uVar8 = 0x24;
LAB_001180ac:
      BYTE_OUT1R4(s,iVar11,rex,0x10,insn3,uVar8,in_stack_ffffffffffffffa8);
      goto LAB_0011811b;
    }
    iVar11 = (uVar10 & 7) * 8 + 4;
    uVar8 = 0x24;
  }
  else {
    if (uVar9 != 5 && offset == 0) {
      if (bVar3) {
        BYTE_OUT2R(s,rex,insn1,uVar9 + (uVar10 & 7) * 8);
      }
      else {
        BYTE_OUT1R3(s,iVar11,rex,0x10,uVar9 + (uVar10 & 7) * 8,uVar8);
      }
      goto LAB_0011811b;
    }
    if (0xfe < offset + 0x7fU) {
      if ((int)uVar8 == offset) {
        if (bVar3) {
          BYTE_OUT2IR(s,rex,insn1,uVar9 + (uVar10 & 7) * 8 + 0x80,uVar8);
        }
        else {
          BYTE_OUT1R3I(s,iVar11,rex,0x10,uVar9 + (uVar10 & 7) * 8 + 0x80,uVar8,
                       in_stack_ffffffffffffffa8);
        }
        goto LAB_0011811b;
      }
      goto LAB_00117f87;
    }
    if (!bVar3) {
      insn3 = uVar9 + (uVar10 & 7) * 8 + 0x40;
      uVar8 = uVar8 & 0xff;
      goto LAB_001180ac;
    }
    iVar11 = uVar9 + (uVar10 & 7) * 8 + 0x40;
    uVar8 = uVar8 & 0xff;
  }
  BYTE_OUT3R(s,rex,insn1,iVar11,uVar8);
LAB_0011811b:
  if ((uint)type < 4) {
    (*(code *)(&DAT_0011e1ec + *(int *)(&DAT_0011e1ec + (ulong)(uint)type * 4)))();
    return;
  }
  return;
}

Assistant:

extern void
x86_64_ploadi(dill_stream s,
              int type,
              int junk,
              int dest,
              int src,
              IMM_TYPE offset)
{
    unsigned char opcode = ld_opcodes[type];
    int tmp_dest = dest;
    x86_64_mach_info smi = (x86_64_mach_info)s->p->mach_info;
    int rex = 0;
    int float_op = 0;
    if ((type == DILL_L) || (type == DILL_UL) || (type == DILL_P)) {
        rex = REX_W;
    }
    switch (type) {
    case DILL_F:
        float_op = 0xf3;
        break;
    case DILL_D:
        float_op = 0xf2;
        break;
    case DILL_C:
    case DILL_UC:
        if (dest >= ESP) {
            /* movb doesn't work for big regs, load to eax */
            tmp_dest = EAX;
        }
        if (type == DILL_UC) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        break;
    case DILL_S:
    case DILL_US:
        if (type == DILL_US) {
            /* clear high bytes */
            if (src == tmp_dest) {
                /* don't destroy source */
                tmp_dest = EAX;
            }
            x86_64_clear(s, tmp_dest);
        }
        BYTE_OUT1(s, 0x66);
        break;
    case DILL_L:
    case DILL_UL:
    case DILL_P:
    /* fall through */
    default:
        break;
    }
    if (smi->pending_prefix != 0) {
        BYTE_OUT1(s, smi->pending_prefix);
        smi->pending_prefix = 0;
    }
    if (src > RDI)
        rex |= REX_B;
    if (tmp_dest > RDI)
        rex |= REX_R;
    if (((0x7 & src) == RSP) &&
        (((offset & 0xffffffff80000000) == 0) ||
         ((offset & 0xffffffff80000000) == 0xffffffff80000000))) {
        /* must use SIB because ModRM has a discontinuity */
        if (offset == 0) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, 0x4), SIB(0, 4, src));
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x0, tmp_dest, 0x4),
                           SIB(0, 4, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R5(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), SIB(0, ESP, 0x4),
                            offset & 0xff);
            } else {
                BYTE_OUT4R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           SIB(0, ESP, 0x4), offset & 0xff);
            }
        } else {
            if (float_op != 0) {
                BYTE_OUT1R4I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, 0x4), SIB(0, 4, src),
                             (int)offset);
            } else {
                BYTE_OUT3IR(s, rex, opcode, ModRM(0x2, tmp_dest, 0x4),
                            SIB(0, 4, src), (int)offset);
            }
        }
    } else {
        if ((offset == 0) &&
            ((src & 0x7) != 5)) { /* avoid discontinuity in ModRM */
            if (float_op != 0) {
                BYTE_OUT1R3(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x0, tmp_dest, src));
            } else {
                BYTE_OUT2R(s, rex, opcode, ModRM(0x0, tmp_dest, src));
            }
        } else if (((intptr_t)offset <= 127) && ((intptr_t)offset > -128)) {
            if (float_op != 0) {
                BYTE_OUT1R4(s, float_op, rex, 0x0f, 0x10,
                            ModRM(0x1, tmp_dest, src), offset & 0xff);
            } else {
                BYTE_OUT3R(s, rex, opcode, ModRM(0x1, tmp_dest, src),
                           offset & 0xff);
            }
        } else if (((offset & 0xffffffff80000000) == 0) ||
                   ((offset & 0xffffffff80000000) == 0xffffffff80000000)) {
            if (float_op != 0) {
                BYTE_OUT1R3I(s, float_op, rex, 0x0f, 0x10,
                             ModRM(0x2, tmp_dest, src), (int)offset);
            } else {
                BYTE_OUT2IR(s, rex, opcode, ModRM(0x2, tmp_dest, src),
                            (int)offset);
            }
        } else {
            /* really big offset */
            if (dest != src) {
                /* use dest since it'll be destroyed by the load */
                x86_64_setl(s, dest, offset);
                x86_64_pload(s, type, 0, dest, src, dest);
            } else {
                /* destroy src, but since it's the same as dest, it's lost
                 * anyway */
                x86_64_arith3i(s, 0, DILL_L, src, src, offset);
                x86_64_ploadi(s, type, 0, dest, src, 0);
            }
        }
    }
    switch (type) {
    case DILL_C:
        x86_64_lshi(s, dest, tmp_dest, 56);
        x86_64_rshai(s, dest, dest, 56);
        break;
    case DILL_S:
        x86_64_lshi(s, dest, tmp_dest, 48);
        x86_64_rshai(s, dest, dest, 48);
        break;
    case DILL_UC:
    case DILL_US:
        if (dest != tmp_dest)
            x86_64_movi(s, dest, tmp_dest);
        break;
    }
}